

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int addk(FuncState *fs,Proto *f,TValue *v)

{
  int nelems;
  lua_State *L_00;
  TValue *pTVar1;
  TValue *io2;
  TValue *io1;
  int k;
  int oldsize;
  lua_State *L;
  TValue *v_local;
  Proto *f_local;
  FuncState *fs_local;
  
  L_00 = fs->ls->L;
  io1._4_4_ = f->sizek;
  nelems = fs->nk;
  pTVar1 = (TValue *)luaM_growaux_(L_00,f->k,nelems,&f->sizek,0x10,0x1ffffff,"constants");
  f->k = pTVar1;
  while (io1._4_4_ < f->sizek) {
    f->k[io1._4_4_].tt_ = '\0';
    io1._4_4_ = io1._4_4_ + 1;
  }
  pTVar1 = f->k;
  pTVar1[nelems].value_ = v->value_;
  pTVar1[nelems].tt_ = v->tt_;
  fs->nk = fs->nk + 1;
  if ((((v->tt_ & 0x40) != 0) && ((f->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L_00,(GCObject *)f,(v->value_).gc);
  }
  return nelems;
}

Assistant:

static int addk (FuncState *fs, Proto *f, TValue *v) {
  lua_State *L = fs->ls->L;
  int oldsize = f->sizek;
  int k = fs->nk;
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek)
    setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}